

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

Label * __thiscall wabt::anon_unknown_0::CWriter::FindLabel(CWriter *this,Var *var,bool mark_used)

{
  void *__s2;
  size_t __n;
  int iVar1;
  ulong uVar2;
  char in_CL;
  undefined7 in_register_00000011;
  long lVar3;
  WriteCOptions **ppWVar4;
  
  lVar3 = CONCAT71(in_register_00000011,mark_used);
  if (*(int *)(lVar3 + 0x20) == 1) {
    uVar2 = ((long)var - (long)this >> 4) * -0x5555555555555555;
    if ((int)uVar2 != 0) {
      __s2 = *(void **)(lVar3 + 0x28);
      __n = *(size_t *)(lVar3 + 0x30);
      uVar2 = uVar2 & 0xffffffff;
      ppWVar4 = &this->options_ + uVar2 * 6;
      do {
        uVar2 = uVar2 - 1;
        this = (CWriter *)(ppWVar4 + -6);
        if ((*(undefined8 *)((long)ppWVar4[-5] + 8) == __n) &&
           ((__n == 0 || (iVar1 = bcmp(*(void **)ppWVar4[-5],__s2,__n), iVar1 == 0)))) break;
        ppWVar4 = (WriteCOptions **)this;
      } while (uVar2 != 0);
      goto LAB_001ab977;
    }
  }
  else {
    if (*(int *)(lVar3 + 0x20) != 0) {
      __assert_fail("var.is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x269,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
    if (((long)var - (long)this >> 4) * -0x5555555555555555 - (ulong)(*(int *)(lVar3 + 0x28) + 1) !=
        0) {
      __assert_fail("var.index() + 1 == label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x266,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
    if (this != (CWriter *)0x0) {
LAB_001ab977:
      if (in_CL != '\0') {
        *(bool *)&(this->c_streams_).
                  super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = true;
      }
      return (Label *)this;
    }
  }
  __assert_fail("label",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x271,
                "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)");
}

Assistant:

const Label* CWriter::FindLabel(const Var& var, bool mark_used) {
  Label* label = nullptr;

  if (var.is_index()) {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    assert(var.index() + 1 == label_stack_.size());
    label = &label_stack_[0];
  } else {
    assert(var.is_name());
    for (Index i = label_stack_.size(); i > 0; --i) {
      label = &label_stack_[i - 1];
      if (label->name == var.name())
        break;
    }
  }

  assert(label);
  if (mark_used) {
    label->used = true;
  }
  return label;
}